

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O3

Pdr_Set_t * Pdr_ManTernarySim(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *vCiObjs;
  Vec_Int_t *pVVar2;
  Vec_Int_t *vValues;
  Vec_Int_t *vValues_00;
  Vec_Int_t *vNodes;
  Vec_Int_t *vVis;
  Vec_Int_t *p_00;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  Pdr_Set_t *pCube_00;
  uint uVar5;
  long lVar6;
  int level;
  Vec_Int_t *pVVar7;
  Aig_Man_t *pAVar9;
  Aig_Obj_t *pAVar10;
  timespec ts;
  long local_68;
  timespec local_58;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  FILE *pFVar8;
  
  pVVar1 = p->vPrio;
  local_40 = p->vLits;
  vCiObjs = p->vCiObjs;
  pVVar2 = p->vCoObjs;
  vValues = p->vCiVals;
  vValues_00 = p->vCoVals;
  vNodes = p->vNodes;
  local_38 = p->vUndo;
  vVis = p->vVisits;
  p_00 = p->vCi2Rem;
  local_48 = p->vRes;
  pVVar7 = (Vec_Int_t *)0x3;
  iVar4 = clock_gettime(3,&local_58);
  level = (int)pVVar7;
  if (iVar4 < 0) {
    local_68 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    local_68 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  pVVar2->nSize = 0;
  if (pCube == (Pdr_Set_t *)0x0) {
    iVar4 = p->iOutCur;
    if (((long)iVar4 < 0) || (pVVar3 = p->pAig->vCos, pVVar3->nSize <= iVar4)) {
LAB_005584cd:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pVVar7 = pVVar2;
    Vec_IntPush(pVVar2,*(int *)((long)pVVar3->pArray[iVar4] + 0x24));
    level = (int)pVVar7;
  }
  else {
    iVar4 = pCube->nLits;
    if (0 < iVar4) {
      lVar6 = 0;
      do {
        if (*(int *)(&pCube->field_0x14 + lVar6 * 4) != -1) {
          uVar5 = (*(int *)(&pCube->field_0x14 + lVar6 * 4) >> 1) + p->pAig->nTruePos;
          if (((int)uVar5 < 0) || (pVVar3 = p->pAig->vCos, pVVar3->nSize <= (int)uVar5))
          goto LAB_005584cd;
          pVVar7 = pVVar2;
          Vec_IntPush(pVVar2,*(int *)((long)pVVar3->pArray[uVar5] + 0x24));
          iVar4 = pCube->nLits;
        }
        level = (int)pVVar7;
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar4);
    }
  }
  if (p->pPars->fVeryVerbose != 0) {
    Abc_Print(level,"Trying to justify cube ");
    if (pCube == (Pdr_Set_t *)0x0) {
      Abc_Print(level,"<prop=fail>");
    }
    else {
      pFVar8 = _stdout;
      Pdr_SetPrint(_stdout,pCube,p->pAig->nRegs,(Vec_Int_t *)0x0);
      level = (int)pFVar8;
    }
    Abc_Print(level," in frame %d.\n",(ulong)(uint)k);
  }
  Pdr_ManCollectCone(p->pAig,pVVar2,vCiObjs,vNodes);
  Pdr_ManCollectValues(p,k,vCiObjs,vValues);
  Pdr_ManCollectValues(p,k,pVVar2,vValues_00);
  if (p->pPars->fVeryVerbose != 0) {
    Pdr_ManPrintCex(p->pAig,vCiObjs,vValues,(Vec_Int_t *)0x0);
  }
  iVar4 = Pdr_ManSimDataInit(p->pAig,vCiObjs,vValues,vNodes,pVVar2,vValues_00,(Vec_Int_t *)0x0);
  pVVar7 = local_38;
  if (iVar4 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrTsim.c"
                  ,0x195,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
  }
  p_00->nSize = 0;
  if (0 < vCiObjs->nSize) {
    lVar6 = 0;
    do {
      pAVar9 = p->pAig;
      pVVar3 = pAVar9->vObjs;
      if (pVVar3 == (Vec_Ptr_t *)0x0) {
        pAVar10 = (Aig_Obj_t *)0x0;
      }
      else {
        uVar5 = vCiObjs->pArray[lVar6];
        if (((int)uVar5 < 0) || (pVVar3->nSize <= (int)uVar5)) goto LAB_005584cd;
        pAVar10 = (Aig_Obj_t *)pVVar3->pArray[uVar5];
      }
      if ((*(uint *)&pAVar10->field_0x18 & 7) == 2) {
        if (pAVar9->nTruePis <= (pAVar10->field_0).CioId) {
          if (pVVar1 != (Vec_Int_t *)0x0) {
            uVar5 = (pAVar10->field_0).CioId - pAVar9->nTruePis;
            if (((int)uVar5 < 0) || (pVVar1->nSize <= (int)uVar5)) goto LAB_005584ec;
            if (pVVar1->pArray[uVar5] != 0) goto LAB_005582df;
          }
          pVVar7->nSize = 0;
          iVar4 = Pdr_ManExtendOne(pAVar9,pAVar10,pVVar7,vVis);
          if (iVar4 == 0) {
            Pdr_ManExtendUndo(p->pAig,pVVar7);
          }
          else {
            Vec_IntPush(p_00,pAVar10->Id);
          }
        }
      }
LAB_005582df:
      lVar6 = lVar6 + 1;
    } while (lVar6 < vCiObjs->nSize);
    if (0 < vCiObjs->nSize) {
      lVar6 = 0;
      do {
        pAVar9 = p->pAig;
        pVVar3 = pAVar9->vObjs;
        if (pVVar3 == (Vec_Ptr_t *)0x0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          uVar5 = vCiObjs->pArray[lVar6];
          if (((int)uVar5 < 0) || (pVVar3->nSize <= (int)uVar5)) goto LAB_005584cd;
          pAVar10 = (Aig_Obj_t *)pVVar3->pArray[uVar5];
        }
        if ((*(uint *)&pAVar10->field_0x18 & 7) == 2) {
          if (pAVar9->nTruePis <= (pAVar10->field_0).CioId && pVVar1 != (Vec_Int_t *)0x0) {
            uVar5 = (pAVar10->field_0).CioId - pAVar9->nTruePis;
            if (((int)uVar5 < 0) || (pVVar1->nSize <= (int)uVar5)) {
LAB_005584ec:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (pVVar1->pArray[uVar5] != 0) {
              pVVar7->nSize = 0;
              iVar4 = Pdr_ManExtendOne(pAVar9,pAVar10,pVVar7,vVis);
              if (iVar4 == 0) {
                Pdr_ManExtendUndo(p->pAig,pVVar7);
              }
              else {
                Vec_IntPush(p_00,pAVar10->Id);
              }
            }
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < vCiObjs->nSize);
    }
  }
  pAVar9 = p->pAig;
  if (p->pPars->fVeryVerbose != 0) {
    Pdr_ManPrintCex(pAVar9,vCiObjs,vValues,p_00);
    pAVar9 = p->pAig;
  }
  iVar4 = Pdr_ManSimDataInit(pAVar9,vCiObjs,vValues,vNodes,pVVar2,vValues_00,p_00);
  pVVar2 = local_40;
  pVVar1 = local_48;
  if (iVar4 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrTsim.c"
                  ,0x1d8,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
  }
  Pdr_ManDeriveResult(p->pAig,vCiObjs,vValues,p_00,local_48,local_40);
  if (pVVar1->nSize < 1) {
    __assert_fail("Vec_IntSize(vRes) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrTsim.c"
                  ,0x1dc,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
  }
  iVar4 = clock_gettime(3,&local_58);
  if (iVar4 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  p->tTsim = p->tTsim + lVar6 + local_68;
  pCube_00 = Pdr_SetCreate(pVVar1,pVVar2);
  if ((k != 0) && (iVar4 = Pdr_SetIsInit(pCube_00,-1), iVar4 != 0)) {
    __assert_fail("k == 0 || !Pdr_SetIsInit(pRes, -1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrTsim.c"
                  ,0x1df,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
  }
  return pCube_00;
}

Assistant:

Pdr_Set_t * Pdr_ManTernarySim( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{
    Pdr_Set_t * pRes;
    Vec_Int_t * vPrio   = p->vPrio;    // priority flops (flop indices)
    Vec_Int_t * vPiLits = p->vLits;    // array of literals (0/1 PI values)
    Vec_Int_t * vCiObjs = p->vCiObjs;  // cone leaves (CI obj IDs)
    Vec_Int_t * vCoObjs = p->vCoObjs;  // cone roots (CO obj IDs)
    Vec_Int_t * vCiVals = p->vCiVals;  // cone leaf values (0/1 CI values)
    Vec_Int_t * vCoVals = p->vCoVals;  // cone root values (0/1 CO values)
    Vec_Int_t * vNodes  = p->vNodes;   // cone nodes (node obj IDs)
    Vec_Int_t * vUndo   = p->vUndo;    // cone undos (node obj IDs)
    Vec_Int_t * vVisits = p->vVisits;  // intermediate (obj IDs)
    Vec_Int_t * vCi2Rem = p->vCi2Rem;  // CIs to be removed (CI obj IDs)
    Vec_Int_t * vRes    = p->vRes;     // final result (flop literals)
    Aig_Obj_t * pObj;
    int i, Entry, RetValue;
    abctime clk = Abc_Clock();

    // collect CO objects
    Vec_IntClear( vCoObjs );
    if ( pCube == NULL ) // the target is the property output
    {
//        Vec_IntPush( vCoObjs, Aig_ObjId(Aig_ManCo(p->pAig, (p->pPars->iOutput==-1)?0:p->pPars->iOutput)) );
        Vec_IntPush( vCoObjs, Aig_ObjId(Aig_ManCo(p->pAig, p->iOutCur)) );
    }
    else // the target is the cube
    {
        for ( i = 0; i < pCube->nLits; i++ )
        {
            if ( pCube->Lits[i] == -1 )
                continue;
            pObj = Saig_ManLi(p->pAig, (pCube->Lits[i] >> 1));
            Vec_IntPush( vCoObjs, Aig_ObjId(pObj) );
        }
    }
if ( p->pPars->fVeryVerbose )
{
Abc_Print( 1, "Trying to justify cube " );
if ( pCube )
    Pdr_SetPrint( stdout, pCube, Aig_ManRegNum(p->pAig), NULL );
else
    Abc_Print( 1, "<prop=fail>" );
Abc_Print( 1, " in frame %d.\n", k );
}

    // collect CI objects
    Pdr_ManCollectCone( p->pAig, vCoObjs, vCiObjs, vNodes );
    // collect values
    Pdr_ManCollectValues( p, k, vCiObjs, vCiVals );
    Pdr_ManCollectValues( p, k, vCoObjs, vCoVals );
    // simulate for the first time
if ( p->pPars->fVeryVerbose )
Pdr_ManPrintCex( p->pAig, vCiObjs, vCiVals, NULL );
    RetValue = Pdr_ManSimDataInit( p->pAig, vCiObjs, vCiVals, vNodes, vCoObjs, vCoVals, NULL );
    assert( RetValue );

#if 1
    // try removing high-priority flops
    Vec_IntClear( vCi2Rem );
    Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
    {
        if ( !Saig_ObjIsLo( p->pAig, pObj ) )
            continue;
        Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
        if ( vPrio != NULL && Vec_IntEntry( vPrio, Entry ) != 0 )
            continue;
        Vec_IntClear( vUndo );
        if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
            Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
        else
            Pdr_ManExtendUndo( p->pAig, vUndo );
    }
    // try removing low-priority flops
    Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
    {
        if ( !Saig_ObjIsLo( p->pAig, pObj ) )
            continue;
        Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
        if ( vPrio == NULL || Vec_IntEntry( vPrio, Entry ) == 0 )
            continue;
        Vec_IntClear( vUndo );
        if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
            Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
        else
            Pdr_ManExtendUndo( p->pAig, vUndo );
    }
#else
    // try removing low-priority flops
    Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
    {
        if ( !Saig_ObjIsLo( p->pAig, pObj ) )
            continue;
        Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
        if ( vPrio == NULL || Vec_IntEntry( vPrio, Entry ) == 0 )
            continue;
        Vec_IntClear( vUndo );
        if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
            Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
        else
            Pdr_ManExtendUndo( p->pAig, vUndo );
    }
    // try removing high-priority flops
    Vec_IntClear( vCi2Rem );
    Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
    {
        if ( !Saig_ObjIsLo( p->pAig, pObj ) )
            continue;
        Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
        if ( vPrio != NULL && Vec_IntEntry( vPrio, Entry ) != 0 )
            continue;
        Vec_IntClear( vUndo );
        if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
            Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
        else
            Pdr_ManExtendUndo( p->pAig, vUndo );
    }
#endif

if ( p->pPars->fVeryVerbose )
Pdr_ManPrintCex( p->pAig, vCiObjs, vCiVals, vCi2Rem );
    RetValue = Pdr_ManSimDataInit( p->pAig, vCiObjs, vCiVals, vNodes, vCoObjs, vCoVals, vCi2Rem );
    assert( RetValue );

    // derive the set of resulting registers
    Pdr_ManDeriveResult( p->pAig, vCiObjs, vCiVals, vCi2Rem, vRes, vPiLits );
    assert( Vec_IntSize(vRes) > 0 );
    p->tTsim += Abc_Clock() - clk;
    pRes = Pdr_SetCreate( vRes, vPiLits );
    assert( k == 0 || !Pdr_SetIsInit(pRes, -1) );
    return pRes;
}